

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O3

void VulkanUtilities::SetObjectTag
               (VkDevice device,uint64_t objectHandle,VkObjectType objectType,uint64_t name,
               size_t tagSize,void *tag)

{
  VkDebugUtilsObjectTagInfoEXT tagInfo;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  uint64_t local_20;
  uint64_t local_18;
  size_t local_10;
  void *local_8;
  
  if ((anonymous_namespace)::SetDebugUtilsObjectTagEXT != (code *)0x0) {
    uStack_30 = 0;
    local_38 = 0x3b9cbe01;
    local_28 = (ulong)objectType;
    local_20 = objectHandle;
    local_18 = name;
    local_10 = tagSize;
    local_8 = tag;
    (*(anonymous_namespace)::SetDebugUtilsObjectTagEXT)(device,&local_38);
  }
  return;
}

Assistant:

void SetObjectTag(VkDevice device, uint64_t objectHandle, VkObjectType objectType, uint64_t name, size_t tagSize, const void* tag)
{
    // Check for valid function pointer (may not be present if not running in a debugging application)
    if (SetDebugUtilsObjectTagEXT == nullptr)
        return;

    VkDebugUtilsObjectTagInfoEXT tagInfo{};
    tagInfo.sType        = VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_TAG_INFO_EXT;
    tagInfo.pNext        = nullptr;
    tagInfo.objectType   = objectType;
    tagInfo.objectHandle = objectHandle;
    tagInfo.tagName      = name;
    tagInfo.tagSize      = tagSize;
    tagInfo.pTag         = tag;
    SetDebugUtilsObjectTagEXT(device, &tagInfo);
}